

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMainParseLoop
          (MessageGenerator *this,Printer *printer,bool use_parse_context)

{
  bool *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  FieldDescriptor *descriptor;
  pointer ppFVar5;
  Nonnull<char_*> pcVar6;
  FieldGeneratorBase *pFVar7;
  Nonnull<const_char_*> failure_msg;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  bool bVar11;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong local_98;
  ulong local_90;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_88 [2];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[16]>(local_88,&local_58,(char (*) [16])"maybe_ref_input");
  pcVar8 = "input";
  if (use_parse_context) {
    pcVar8 = "ref input";
  }
  local_98 = (ulong)use_parse_context;
  std::__cxx11::string::_M_replace
            ((long)local_88[0].first.field_1.slot_ + 0x10,0,
             *(char **)((long)local_88[0].first.field_1.slot_ + 0x18),(ulong)pcVar8);
  io::Printer::Emit(printer,0,0,0xa1,
                    "\n    uint tag;\n    while ((tag = input.ReadTag()) != 0) {\n    if ((tag & 7) == 4) {\n      // Abort on any end group tag.\n      return;\n    }\n    switch(tag) {\n  "
                   );
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  bVar11 = this->has_extension_ranges_ != false;
  sVar9 = 0x6c;
  if (bVar11) {
    sVar9 = 0xc3;
  }
  pcVar8 = 
  "default:\n  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  break;\n"
  ;
  if (bVar11) {
    pcVar8 = 
    "default:\n  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, $maybe_ref_input$)) {\n    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, $maybe_ref_input$);\n  }\n  break;\n"
    ;
  }
  text_05._M_str = pcVar8;
  text_05._M_len = sVar9;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_58,text_05);
  ppFVar5 = (this->fields_by_number_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->fields_by_number_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    uVar10 = 0;
    do {
      descriptor = ppFVar5[uVar10];
      iVar3 = descriptor->number_;
      uVar4 = *(uint *)(protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                       (ulong)descriptor->type_ * 4);
      bVar2 = descriptor->field_0x1;
      bVar11 = (bool)((bVar2 & 0x20) >> 5);
      local_90 = uVar10;
      if (0xbf < bVar2 == bVar11) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar11,0xbf < bVar2,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_88);
      }
      if (((descriptor->field_0x1 & 0x20) != 0) && (descriptor->type_ - 0xd < 0xfffffffc)) {
        pbVar1 = &local_88[0].second;
        pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                           (descriptor->number_ * 8 + 2,pbVar1);
        local_88[0].first.ctrl_ = pcVar6 + -(long)pbVar1;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_88[0].first.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)pbVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pbVar1,pcVar6);
        text._M_str = "case $packed_tag$:\n";
        text._M_len = 0x13;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text,(char (*) [11])"packed_tag",&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar1 = &local_88[0].second;
      pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer(iVar3 << 3 | uVar4,pbVar1);
      local_88[0].first.ctrl_ = pcVar6 + -(long)pbVar1;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_88[0].first.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pbVar1,pcVar6);
      text_00._M_str = "case $tag$: {\n";
      text_00._M_len = 0xe;
      io::Printer::Print<char[4],std::__cxx11::string>
                (printer,text_00,(char (*) [4])0x5d574c,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      pFVar7 = CreateFieldGeneratorInternal(this,descriptor);
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[9])(pFVar7,printer,local_98);
      text_01._M_str = "break;\n";
      text_01._M_len = 7;
      io::Printer::Print<>(printer,text_01);
      io::Printer::Outdent(printer);
      text_02._M_str = "}\n";
      text_02._M_len = 2;
      io::Printer::Print<>(printer,text_02);
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar7);
      uVar10 = local_90 + 1;
      ppFVar5 = (this->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->fields_by_number_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3)
            );
  }
  io::Printer::Outdent(printer);
  text_03._M_str = "}\n";
  text_03._M_len = 2;
  io::Printer::Print<>(printer,text_03);
  io::Printer::Outdent(printer);
  text_04._M_str = "}\n";
  text_04._M_len = 2;
  io::Printer::Print<>(printer,text_04);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_58);
  return;
}

Assistant:

void MessageGenerator::GenerateMainParseLoop(io::Printer* printer,
                                             bool use_parse_context) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["maybe_ref_input"] = use_parse_context ? "ref input" : "input";

  printer->Emit(R"csharp(
    uint tag;
    while ((tag = input.ReadTag()) != 0) {
    if ((tag & 7) == 4) {
      // Abort on any end group tag.
      return;
    }
    switch(tag) {
  )csharp");
  printer->Indent();
  printer->Indent();
  if (has_extension_ranges_) {
    printer->Print(vars,
                   "default:\n"
                   "  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, "
                   "$maybe_ref_input$)) {\n"
                   "    _unknownFields = "
                   "pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, "
                   "$maybe_ref_input$);\n"
                   "  }\n"
                   "  break;\n");
  } else {
    printer->Print(
        vars,
        "default:\n"
        "  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, "
        "$maybe_ref_input$);\n"
        "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32_t tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array
    // call; the two generated cases are the packed and unpacked tags.
    // TODO: Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print("case $packed_tag$:\n", "packed_tag",
                     absl::StrCat(internal::WireFormatLite::MakeTag(
                         field->number(),
                         internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", absl::StrCat(tag));
    printer->Indent();
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer, use_parse_context);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n");  // switch
  printer->Outdent();
  printer->Print("}\n");  // while
}